

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyIntegerGreaterOrEqual2
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,GLint reference1
          )

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[2]> floatVector2;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::StateQueryMemoryWriteGuard
            (&floatVector2);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector2.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    (&floatVector2,testCtx);
  if ((bVar1) &&
     ((floatVector2.m_value[0] < (float)reference0 || (floatVector2.m_value[1] < (float)reference1))
     )) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected greater or equal to ");
    std::ostream::operator<<(this_00,(float)reference0);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,(float)reference1);
    std::operator<<((ostream *)this_00,"; got ");
    std::ostream::operator<<(this_00,floatVector2.m_value[0]);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,floatVector2.m_value[1]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> floatVector2;
	glGetFloatv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < GLfloat(reference0) || floatVector2[1] < GLfloat(reference1))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLfloat(reference0) << ", " << GLfloat(reference1) << "; got " << floatVector2[0] << ", " << floatVector2[1] << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}